

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeFreeCursor(Vdbe *p,VdbeCursor *pCx)

{
  long *plVar1;
  u8 uVar2;
  VdbeSorter *pSorter;
  sqlite3 *db;
  long *plVar3;
  
  if (pCx != (VdbeCursor *)0x0) {
    uVar2 = pCx->eCurType;
    if (uVar2 == '\0') {
      if ((pCx->field_0x5 & 1) == 0) {
        sqlite3BtreeCloseCursor((pCx->uc).pCursor);
        return;
      }
      if (pCx->pBtx != (Btree *)0x0) {
        sqlite3BtreeClose(pCx->pBtx);
        return;
      }
    }
    else {
      if (uVar2 == '\x02') {
        plVar3 = *(long **)(pCx->uc).pCursor;
        plVar1 = plVar3 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        (**(code **)(*plVar3 + 0x38))();
        return;
      }
      if ((uVar2 == '\x01') && (pSorter = (pCx->uc).pSorter, pSorter != (VdbeSorter *)0x0)) {
        db = p->db;
        sqlite3VdbeSorterReset(db,pSorter);
        sqlite3_free((pSorter->list).aMemory);
        sqlite3DbFreeNN(db,pSorter);
        (pCx->uc).pCursor = (BtCursor *)0x0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursor(Vdbe *p, VdbeCursor *pCx){
  if( pCx==0 ){
    return;
  }
  assert( pCx->pBtx==0 || pCx->eCurType==CURTYPE_BTREE );
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      if( pCx->isEphemeral ){
        if( pCx->pBtx ) sqlite3BtreeClose(pCx->pBtx);
        /* The pCx->pCursor will be close automatically, if it exists, by
        ** the call above. */
      }else{
        assert( pCx->uc.pCursor!=0 );
        sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      }
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}